

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterBase.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterBase::SscWriterBase
          (SscWriterBase *this,IO *io,string *name,Mode mode,MPI_Comm comm)

{
  bool *pbVar1;
  map *pmVar2;
  allocator local_51;
  int providedMpiMode;
  
  this->_vptr_SscWriterBase = (_func_int **)&PTR__SscWriterBase_0016f070;
  Buffer::Buffer(&this->m_Buffer,1);
  this->m_CurrentStep = -1;
  std::__cxx11::string::string((string *)&this->m_Name,(string *)name);
  this->m_Verbosity = 0;
  this->m_OpenTimeoutSecs = 10;
  this->m_Threading = false;
  this->m_IO = io;
  std::__cxx11::string::string((string *)&providedMpiMode,"Verbose",&local_51);
  pmVar2 = (map *)(io + 0x60);
  adios2::helper::GetParameter<int>(pmVar2,(string *)&providedMpiMode,&this->m_Verbosity);
  std::__cxx11::string::~string((string *)&providedMpiMode);
  std::__cxx11::string::string((string *)&providedMpiMode,"Threading",&local_51);
  pbVar1 = &this->m_Threading;
  adios2::helper::GetParameter<bool>(pmVar2,(string *)&providedMpiMode,pbVar1);
  std::__cxx11::string::~string((string *)&providedMpiMode);
  std::__cxx11::string::string((string *)&providedMpiMode,"OpenTimeoutSecs",&local_51);
  adios2::helper::GetParameter<int>(pmVar2,(string *)&providedMpiMode,&this->m_OpenTimeoutSecs);
  std::__cxx11::string::~string((string *)&providedMpiMode);
  MPI_Query_thread(&providedMpiMode);
  if ((*pbVar1 == true) && (providedMpiMode != 3)) {
    *pbVar1 = false;
  }
  SyncMpiPattern(this,comm);
  return;
}

Assistant:

SscWriterBase::SscWriterBase(IO &io, const std::string &name, const Mode mode, MPI_Comm comm)
: m_Name(name), m_IO(io)
{

    helper::GetParameter(io.m_Parameters, "Verbose", m_Verbosity);
    helper::GetParameter(io.m_Parameters, "Threading", m_Threading);
    helper::GetParameter(io.m_Parameters, "OpenTimeoutSecs", m_OpenTimeoutSecs);

    int providedMpiMode;
    MPI_Query_thread(&providedMpiMode);
    if (m_Threading && providedMpiMode != MPI_THREAD_MULTIPLE)
    {
        m_Threading = false;
    }

    SyncMpiPattern(comm);
}